

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O0

void enumerate_ints(MAFSA_automaton ma,MAFSA_stack_struct *ptr_stack,uint32_t cstate,
                   MAFSA_automaton_string_handler fetcher,void *user_data)

{
  MAFSA_letter *pMVar1;
  MAFSA_letter l;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  code *in_RCX;
  uint32_t in_EDX;
  MAFSA_stack_struct *in_RSI;
  long in_RDI;
  MAFSA_automaton_string_handler in_R8;
  uint32_t where;
  uint32_t child;
  uint32_t links_begin;
  uint32_t data;
  MAFSA_automaton_string_handler fetcher_00;
  code *pcVar5;
  undefined4 in_stack_ffffffffffffffe8;
  MAFSA_stack_struct *st;
  
  iVar2 = node_is_final(in_EDX);
  fetcher_00 = in_R8;
  pcVar5 = in_RCX;
  if (iVar2 != 0) {
    pMVar1 = in_RSI->buffer;
    sVar4 = stack_size(in_RSI);
    (*in_RCX)(in_R8,pMVar1,sVar4);
  }
  uVar3 = node_get_children_start(in_EDX);
  data = *(uint32_t *)(*(long *)(in_RDI + 8) + (ulong)uVar3 * 4);
  while( true ) {
    iVar2 = link_is_terminating(data);
    if (iVar2 != 0) break;
    st = in_RSI;
    l = link_get_label(data);
    stack_push(in_RSI,l);
    link_get_link(data);
    enumerate_ints((MAFSA_automaton)st,
                   (MAFSA_stack_struct *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                   (uint32_t)((ulong)pcVar5 >> 0x20),fetcher_00,(void *)CONCAT44(uVar3,data));
    stack_pop(st);
    uVar3 = uVar3 + 1;
    data = *(uint32_t *)(*(long *)(in_RDI + 8) + (ulong)uVar3 * 4);
    in_RSI = st;
  }
  return;
}

Assistant:

static void enumerate_ints(const MAFSA_automaton ma, struct MAFSA_stack_struct *ptr_stack,
    uint32_t cstate, MAFSA_automaton_string_handler fetcher, void *user_data)
{
    uint32_t links_begin, child, where;

    if (node_is_final(cstate))
    {
        fetcher(user_data, ptr_stack->buffer, stack_size(ptr_stack));
    }

    links_begin = node_get_children_start(cstate);

    for (child = ma->ptr_links[links_begin]; !link_is_terminating(child); child = ma->ptr_links[++links_begin])
    {
        stack_push(ptr_stack, link_get_label(child));

        where = link_get_link(child);

        enumerate_ints(ma, ptr_stack, ma->ptr_nodes[where], fetcher, user_data);

        stack_pop(ptr_stack);
    }
}